

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
::PerformDefaultAction
          (Result *__return_storage_ptr__,
          FunctionMocker<ot::commissioner::Error_(unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
          *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<ot::commissioner::Error_(unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
  *this_00;
  Action<ot::commissioner::Error_(unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
  *this_01;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  ArgumentTuple local_28;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 ==
      (OnCallSpec<ot::commissioner::Error_(unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
       *)0x0) {
    std::operator+(&bStack_48,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    DefaultValue<ot::commissioner::Error>::Get();
    std::__cxx11::string::~string((string *)&bStack_48);
  }
  else {
    this_01 = OnCallSpec<ot::commissioner::Error_(unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
              ::GetAction(this_00);
    local_28.
    super__Tuple_impl<0UL,_unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>.
    super__Tuple_impl<1UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>.
    super__Head_base<1UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_false>._M_head_impl.
    __r = (_Head_base<1UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_false>)
          (args->
          super__Tuple_impl<0UL,_unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
          ).super__Tuple_impl<1UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>.
          super__Head_base<1UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_false>.
          _M_head_impl.__r;
    local_28.
    super__Tuple_impl<0UL,_unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>.
    super__Head_base<0UL,_unsigned_short,_false>._M_head_impl =
         (args->
         super__Tuple_impl<0UL,_unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
         ).super__Head_base<0UL,_unsigned_short,_false>._M_head_impl;
    Action<ot::commissioner::Error_(unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
    ::Perform(__return_storage_ptr__,this_01,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }